

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRationalBezierCurve::~IfcRationalBezierCurve
          (IfcRationalBezierCurve *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x2a];
  *(void **)&this->field_0x10 = vtt[0x2b];
  *(void **)&this->field_0x20 = vtt[0x2c];
  *(void **)&this->field_0x30 = vtt[0x2d];
  *(void **)&this->field_0x40 = vtt[0x2e];
  *(void **)&this->field_0xb0 = vtt[0x2f];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
  _vptr_ObjectHelper = (_func_int **)vtt[0x30];
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
              field_0x10);
  IfcBSplineCurve::~IfcBSplineCurve((IfcBSplineCurve *)this,vtt + 2);
  return;
}

Assistant:

IfcRationalBezierCurve() : Object("IfcRationalBezierCurve") {}